

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uhitm.c
# Opt level: O0

schar find_roll_to_hit(monst *mtmp)

{
  char cVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  char *pcVar5;
  int iVar6;
  char local_34;
  int useskill;
  int twowepskill;
  int wepskill;
  int tmp2;
  schar tmp;
  monst *mtmp_local;
  
  iVar2 = (int)u.uluck;
  iVar6 = (int)u.moreluck;
  iVar3 = abon();
  iVar4 = find_mac(mtmp);
  if (u.umonnum == u.umonster) {
    local_34 = (char)u.ulevel;
  }
  else {
    local_34 = (youmonst.data)->mlevel;
  }
  wepskill._3_1_ =
       (char)((iVar2 + iVar6) / 3) + '\x01' + (char)iVar3 + (char)iVar4 + u.uhitinc + local_34;
  check_caitiff(mtmp);
  if (((urole.malenum == 0x165) && ((*(uint *)&mtmp->field_0x60 >> 0x16 & 1) != 0)) &&
     (-10 < u.ualign.record)) {
    pline("You dishonorably attack the innocent!");
    adjalign(-1);
  }
  if ((*(uint *)&mtmp->field_0x60 >> 0x14 & 1) != 0) {
    wepskill._3_1_ = wepskill._3_1_ + '\x02';
  }
  if ((*(uint *)&mtmp->field_0x60 >> 0x10 & 1) != 0) {
    wepskill._3_1_ = wepskill._3_1_ + '\x02';
  }
  if ((*(uint *)&mtmp->field_0x60 >> 0x13 & 1) != 0) {
    *(uint *)&mtmp->field_0x60 = *(uint *)&mtmp->field_0x60 & 0xfff7ffff;
    wepskill._3_1_ = wepskill._3_1_ + '\x02';
  }
  if ((*(uint *)&mtmp->field_0x60 >> 0x12 & 1) == 0) {
    wepskill._3_1_ = wepskill._3_1_ + '\x04';
    iVar2 = rn2(10);
    if (iVar2 == 0) {
      *(uint *)&mtmp->field_0x60 = *(uint *)&mtmp->field_0x60 & 0xfffbffff | 0x40000;
      mtmp->mfrozen = '\0';
    }
  }
  if ((mtmp->data->mflags2 & 0x80) != 0) {
    if (u.umonnum == u.umonster) {
      if (urace.malenum != 0x111) goto LAB_0031b253;
    }
    else if (((youmonst.data)->mflags2 & 0x10) == 0) goto LAB_0031b253;
    wepskill._3_1_ = wepskill._3_1_ + '\x01';
  }
LAB_0031b253:
  if ((uwep != (obj *)0x0) && (uwep->otyp == 0x216)) {
    wepskill._3_1_ = wepskill._3_1_ + '\x04';
  }
  if ((urole.malenum == 0x160) && (u.umonnum == u.umonster)) {
    if (uarm == (obj *)0x0) {
      if ((uwep == (obj *)0x0) && (uarms == (obj *)0x0)) {
        wepskill._3_1_ = wepskill._3_1_ + (char)(u.ulevel / 3) + '\x02';
      }
    }
    else {
      pline("Your armor is rather cumbersome...");
      wepskill._3_1_ = wepskill._3_1_ - (char)(urole.spelarmr / 2);
    }
  }
  iVar2 = near_capacity();
  if (iVar2 != 0) {
    wepskill._3_1_ = wepskill._3_1_ - ((char)(iVar2 << 1) + -1);
  }
  if (u.utrap != 0) {
    wepskill._3_1_ = wepskill._3_1_ + -3;
  }
  if (u.umonnum == u.umonster) {
    iVar2 = hitval(uwep,mtmp);
    iVar3 = weapon_hit_bonus(uwep);
    wepskill._3_1_ = wepskill._3_1_ + (char)iVar2 + (char)iVar3;
  }
  if ((uwep != (obj *)0x0) && ((u._1052_1_ & 1) == 0)) {
    iVar2 = weapon_type(uwep);
    cVar1 = u.weapon_skills[iVar2].skill;
    if ((u.twoweap != '\0') && (u.weapon_skills[0x26].skill < cVar1)) {
      cVar1 = u.weapon_skills[0x26].skill;
    }
    if (((cVar1 == '\x01') || (cVar1 == '\0')) && ('\x0f' < wepskill._3_1_)) {
      wepskill._3_1_ = '\x0f';
      iVar2 = rn2(3);
      if (iVar2 == 0) {
        if ((uwep->oclass == '\x02') ||
           ((uwep->oclass == '\x06' && (objects[uwep->otyp].oc_subtyp != '\0')))) {
          pline("You aren\'t sure you\'re doing this the right way...");
        }
        else {
          pcVar5 = aobjnam(uwep,(char *)0x0);
          pline("You are having a tough time swinging the %s.",pcVar5);
        }
      }
    }
  }
  return wepskill._3_1_;
}

Assistant:

schar find_roll_to_hit(struct monst *mtmp)
{
	schar tmp;
	int tmp2, wepskill, twowepskill, useskill;

	tmp = 1 + Luck / 3 + abon() + find_mac(mtmp) + u.uhitinc +
		maybe_polyd(youmonst.data->mlevel, u.ulevel);

	check_caitiff(mtmp);

/*	attacking peaceful creatures is bad for the samurai's giri */
	if (Role_if (PM_SAMURAI) && mtmp->mpeaceful &&
	    u.ualign.record > -10) {
	    pline("You dishonorably attack the innocent!");
	    adjalign(-1);
	}

/*	Adjust vs. (and possibly modify) monster state.		*/

	if (mtmp->mstun) tmp += 2;
	if (mtmp->mflee) tmp += 2;

	if (mtmp->msleeping) {
		mtmp->msleeping = 0;
		tmp += 2;
	}
	if (!mtmp->mcanmove) {
		tmp += 4;
		if (!rn2(10)) {
			mtmp->mcanmove = 1;
			mtmp->mfrozen = 0;
		}
	}
	if (is_orc(mtmp->data) && maybe_polyd(is_elf(youmonst.data),
			Race_if (PM_ELF)))
	    tmp++;

	/* Adding iron ball as a weapon skill gives a -4 penalty for
	 * unskilled vs no penalty for non-weapon objects.  Add 4 to
	 * compensate.
	 */
	if (uwep && uwep->otyp == HEAVY_IRON_BALL)
	    tmp += 4;

	if (Role_if(PM_MONK) && !Upolyd) {
	    if (uarm) {
		pline("Your armor is rather cumbersome...");
		tmp -= urole.spelarmr / 2;
	    } else if (!uwep && !uarms) {
		tmp += (u.ulevel / 3) + 2;
	    }
	}

/*	with a lot of luggage, your agility diminishes */
	if ((tmp2 = near_capacity()) != 0) tmp -= (tmp2*2) - 1;
	if (u.utrap) tmp -= 3;
/*	Some monsters have a combination of weapon attacks and non-weapon
 *	attacks.  It is therefore wrong to add hitval to tmp; we must add
 *	it only for the specific attack (in hmonas()).
 */
	if (!Upolyd) {
		tmp += hitval(uwep, mtmp);
		tmp += weapon_hit_bonus(uwep); /* picks up bare-handed bonus */
	}
	/* Let's make UNSKILLED matter, shall we?  If you're UNSKILLED,
	 * you never get more than an 75% chance to hit anything.
	 * (we'll let the fisticuffs guys slide on this, they've got
	 * a hard enough row to hoe anyway)
	 */
	if (uwep && !u.uswallow) {
	    wepskill = P_SKILL(weapon_type(uwep));
	    twowepskill = P_SKILL(P_TWO_WEAPON_COMBAT);
	    /* use the lesser skill of two-weapon or your primary */
	    useskill = (u.twoweap && twowepskill < wepskill) ? twowepskill : wepskill;
	    if ((useskill == P_UNSKILLED || useskill == P_ISRESTRICTED) && tmp > 15) {
		tmp = 15;
		if (!rn2(3)) {
		    /* there's no 'right way' to swing a cockatrice corpse... */
		    if (uwep->oclass != WEAPON_CLASS && !is_weptool(uwep)) {
			pline("You are having a tough time swinging the %s.",
			      aobjnam(uwep, NULL));
		    } else {
			pline("You aren't sure you're doing this the right way...");
		    }
		}
	    }
	}
	return tmp;
}